

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O1

void pbrt::detail::
     stringPrintfRecursive<pbrt::CurveType_const&,pstd::span<pbrt::Point3<float>const>,pstd::span<float_const>,pstd::span<pbrt::Normal3<float>const>,float_const&,float_const&,pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&>
               (string *s,char *fmt,CurveType *v,span<const_pbrt::Point3<float>_> *args,
               span<const_float> *args_1,span<const_pbrt::Normal3<float>_> *args_2,float *args_3,
               float *args_4,Transform *args_5,Transform *args_6,bool *args_7,bool *args_8)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  long *plVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *s_00;
  CurveType type;
  string str;
  string nextFmt;
  char *fmt_local;
  long *local_1d8;
  long local_1c8 [2];
  stringstream ss;
  ostream local_1a8;
  undefined7 uStack_1a7;
  ios_base local_138 [264];
  
  fmt_local = fmt;
  copyToFormatString(&nextFmt,&fmt_local,s);
  lVar5 = std::__cxx11::string::find('\0',0x2a);
  lVar6 = std::__cxx11::string::find('\0',0x73);
  lVar7 = std::__cxx11::string::find('\0',100);
  _Var2 = nextFmt._M_dataplus;
  if (lVar5 == -1) {
    if (lVar7 == -1) {
      if (lVar6 == -1) {
        if (nextFmt._M_string_length == 0) {
          s_00 = "Excess values passed to Printf.";
          iVar4 = 0x10d;
          goto LAB_0024ec73;
        }
        iVar4 = snprintf((char *)0x0,0,nextFmt._M_dataplus._M_p,(ulong)*v);
        local_1a8 = (ostream)0x0;
        _ss = &local_1a8;
        std::__cxx11::string::resize((ulong)&ss,(char)(iVar4 + 1));
        snprintf((char *)_ss,(long)(iVar4 + 1),_Var2._M_p,(ulong)*v);
        std::__cxx11::string::pop_back();
        std::__cxx11::string::_M_append((char *)s,(ulong)_ss);
        if (_ss != &local_1a8) {
          operator_delete(_ss,CONCAT71(uStack_1a7,local_1a8) + 1);
        }
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        pbrt::ToString_abi_cxx11_(&str,(pbrt *)(ulong)*v,type);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,str._M_dataplus._M_p,str._M_string_length);
        paVar1 = &str.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != paVar1) {
          operator_delete(str._M_dataplus._M_p,
                          CONCAT71(str.field_2._M_allocated_capacity._1_7_,
                                   str.field_2._M_local_buf[0]) + 1);
        }
        _Var2._M_p = nextFmt._M_dataplus._M_p;
        std::__cxx11::stringbuf::str();
        plVar3 = local_1d8;
        iVar4 = snprintf((char *)0x0,0,_Var2._M_p,local_1d8);
        str._M_string_length = 0;
        str.field_2._M_local_buf[0] = '\0';
        str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::resize((ulong)&str,(char)(iVar4 + 1));
        snprintf(str._M_dataplus._M_p,(long)(iVar4 + 1),_Var2._M_p,plVar3);
        std::__cxx11::string::pop_back();
        std::__cxx11::string::_M_append((char *)s,(ulong)str._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != paVar1) {
          operator_delete(str._M_dataplus._M_p,
                          CONCAT71(str.field_2._M_allocated_capacity._1_7_,
                                   str.field_2._M_local_buf[0]) + 1);
        }
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
      stringPrintfRecursive<pstd::span<pbrt::Point3<float>const>,pstd::span<float_const>,pstd::span<pbrt::Normal3<float>const>,float_const&,float_const&,pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&>
                (s,fmt_local,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)nextFmt._M_dataplus._M_p != &nextFmt.field_2) {
        operator_delete(nextFmt._M_dataplus._M_p,nextFmt.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    s_00 = "Non-integral type passed to %d format.";
    iVar4 = 0x104;
  }
  else {
    s_00 = "Non-integral type provided for %* format.";
    iVar4 = 0xe8;
  }
LAB_0024ec73:
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
           ,iVar4,s_00);
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}